

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O2

void FAudio_INTERNAL_Convert_U8_To_F32_SSE2(uint8_t *src,float *dst,uint32_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [12];
  undefined8 uVar9;
  undefined1 auVar10 [16];
  long lVar11;
  float *pfVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ushort uVar17;
  ushort uVar18;
  undefined1 auVar19 [16];
  
  uVar15 = (ulong)(len - 1);
  lVar16 = 0x3c;
  lVar14 = 0;
  for (pfVar12 = dst + (uVar15 - 0xf);
      (auVar10 = _DAT_00125a50, iVar13 = (int)lVar14, len + iVar13 != 0 &&
      (((ulong)pfVar12 & 0xf) != 0)); pfVar12 = pfVar12 + -1) {
    dst[uVar15 + lVar14] = (float)src[lVar14 + uVar15] * 0.0078125 + -1.0;
    lVar14 = lVar14 + -1;
    lVar16 = lVar16 + 4;
  }
  lVar16 = (long)dst + (uVar15 * 4 - lVar16);
  if ((((int)src + (len - 1) + iVar13) - 0xf & 0xf) == 0) {
    for (; iVar13 = (int)lVar14, 0xf < (int)(len + iVar13); lVar14 = lVar14 + -0x10) {
      auVar1 = *(undefined1 (*) [16])(src + lVar14 + (uVar15 - 0xf));
      auVar19 = auVar1 & auVar10;
      uVar17 = auVar1._6_2_ >> 8;
      uVar18 = auVar1._8_2_ >> 8;
      auVar8._2_2_ = uVar18;
      auVar8._0_2_ = uVar17;
      auVar2._10_2_ = 0;
      auVar2._0_10_ = auVar19._0_10_;
      auVar2._12_2_ = auVar19._6_2_;
      auVar4._8_2_ = auVar19._4_2_;
      auVar4._0_8_ = auVar19._0_8_;
      auVar4._10_4_ = auVar2._10_4_;
      auVar6._6_8_ = 0;
      auVar6._0_6_ = auVar4._8_6_;
      auVar5._4_2_ = auVar19._2_2_;
      auVar5._0_4_ = auVar19._0_4_;
      auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
      auVar8._4_8_ = 0;
      auVar3._12_2_ = uVar17;
      auVar3._0_12_ = auVar8 << 0x30;
      uVar9 = CONCAT44(auVar3._10_4_,CONCAT22(auVar1._4_2_ >> 8,uVar17));
      auVar7._6_8_ = 0;
      auVar7._0_6_ = (uint6)((ulong)uVar9 >> 0x10);
      pfVar12 = dst + uVar15 + lVar14 + -0xf;
      *pfVar12 = (float)(auVar19._0_4_ & 0xffff) * 0.0078125 + -1.0;
      pfVar12[1] = (float)(ushort)(auVar1._0_2_ >> 8) * 0.0078125 + -1.0;
      pfVar12[2] = (float)auVar5._4_4_ * 0.0078125 + -1.0;
      pfVar12[3] = (float)(int)CONCAT82(SUB148(auVar7 << 0x40,6),auVar1._2_2_ >> 8) * 0.0078125 +
                   -1.0;
      pfVar12 = dst + uVar15 + lVar14 + -0xb;
      *pfVar12 = (float)auVar4._8_4_ * 0.0078125 + -1.0;
      pfVar12[1] = (float)(int)((ulong)uVar9 >> 0x10) * 0.0078125 + -1.0;
      pfVar12[2] = (float)(auVar2._10_4_ >> 0x10) * 0.0078125 + -1.0;
      pfVar12[3] = (float)(auVar3._10_4_ >> 0x10) * 0.0078125 + -1.0;
      pfVar12 = dst + uVar15 + lVar14 + -7;
      *(ulong *)pfVar12 =
           CONCAT44((float)uVar18 * 0.0078125 + -1.0,(float)auVar19._8_2_ * 0.0078125 + -1.0);
      pfVar12[4] = (float)auVar19._10_2_ * 0.0078125 + -1.0;
      pfVar12[5] = (float)(ushort)(auVar1._10_2_ >> 8) * 0.0078125 + -1.0;
      pfVar12 = dst + uVar15 + lVar14 + -3;
      *pfVar12 = (float)auVar19._12_2_ * 0.0078125 + -1.0;
      pfVar12[1] = (float)(ushort)(auVar1._12_2_ >> 8) * 0.0078125 + -1.0;
      pfVar12[2] = (float)auVar19._14_2_ * 0.0078125 + -1.0;
      pfVar12[3] = (float)(ushort)(auVar1._14_2_ >> 8) * 0.0078125 + -1.0;
      lVar16 = lVar16 + -0x40;
    }
  }
  for (lVar11 = 0; -(len + iVar13) != (int)lVar11; lVar11 = lVar11 + -1) {
    *(float *)(lVar16 + 0x3c + lVar11 * 4) = (float)src[lVar11 + lVar14 + uVar15] * 0.0078125 + -1.0
    ;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Convert_U8_To_F32_SSE2(
	const uint8_t *restrict src,
	float *restrict dst,
	uint32_t len
) {
    int i;
    src += len - 1;
    dst += len - 1;

    /* Get dst aligned to 16 bytes (since buffer is growing, we don't have to worry about overreading from src) */
    for (i = len; i && (((size_t) (dst-15)) & 15); --i, --src, --dst) {
        *dst = (((float) *src) * DIVBY128) - 1.0f;
    }

    src -= 15; dst -= 15;  /* adjust to read SSE blocks from the start. */
    FAudio_assert(!i || ((((size_t) dst) & 15) == 0));

    /* Make sure src is aligned too. */
    if ((((size_t) src) & 15) == 0) {
        /* Aligned! Do SSE blocks as long as we have 16 bytes available. */
        const __m128i *mmsrc = (const __m128i *) src;
        const __m128i zero = _mm_setzero_si128();
        const __m128 divby128 = _mm_set1_ps(DIVBY128);
        const __m128 minus1 = _mm_set1_ps(-1.0f);
        while (i >= 16) {   /* 16 * 8-bit */
            const __m128i bytes = _mm_load_si128(mmsrc);  /* get 16 uint8 into an XMM register. */
            /* treat as int16, shift left to clear every other sint16, then back right with zero-extend. Now uint16. */
            const __m128i shorts1 = _mm_srli_epi16(_mm_slli_epi16(bytes, 8), 8);
            /* right-shift-zero-extend gets us uint16 with the other set of values. */
            const __m128i shorts2 = _mm_srli_epi16(bytes, 8);
            /* unpack against zero to make these int32, convert to float, multiply, add. Whew! */
            /* Note that AVX2 can do floating point multiply+add in one instruction, fwiw. SSE2 cannot. */
            const __m128 floats1 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpacklo_epi16(shorts1, zero)), divby128), minus1);
            const __m128 floats2 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpacklo_epi16(shorts2, zero)), divby128), minus1);
            const __m128 floats3 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpackhi_epi16(shorts1, zero)), divby128), minus1);
            const __m128 floats4 = _mm_add_ps(_mm_mul_ps(_mm_cvtepi32_ps(_mm_unpackhi_epi16(shorts2, zero)), divby128), minus1);
            /* Interleave back into correct order, store. */
            _mm_store_ps(dst, _mm_unpacklo_ps(floats1, floats2));
            _mm_store_ps(dst+4, _mm_unpackhi_ps(floats1, floats2));
            _mm_store_ps(dst+8, _mm_unpacklo_ps(floats3, floats4));
            _mm_store_ps(dst+12, _mm_unpackhi_ps(floats3, floats4));
            i -= 16; mmsrc--; dst -= 16;
        }

        src = (const uint8_t *) mmsrc;
    }

    src += 15; dst += 15;  /* adjust for any scalar finishing. */

    /* Finish off any leftovers with scalar operations. */
    while (i) {
        *dst = (((float) *src) * DIVBY128) - 1.0f;
        i--; src--; dst--;
    }
}